

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

bool __thiscall argparse::Argument::get<bool>(Argument *this)

{
  bool bVar1;
  logic_error *this_00;
  pointer __any;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __any = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__any == (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_58,"No value provided for \'",
                     (this->mNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::operator+(&local_38,&bStack_58,"\'.");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    __any = &this->mDefaultValue;
  }
  bVar1 = std::any_cast<bool>(__any);
  return bVar1;
}

Assistant:

T get() const {
            if (!mValues.empty()) {
                if constexpr (details::is_container_v<T>)
                    return any_cast_container<T>(mValues);
                else
                    return std::any_cast<T>(mValues.front());
            }
            if (mDefaultValue.has_value()) {
                return std::any_cast<T>(mDefaultValue);
            }
            throw std::logic_error("No value provided for '" + mNames.back() + "'.");
        }